

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_sync.c
# Opt level: O3

int pt_sync_forward(uint8_t **sync,uint8_t *pos,pt_config *config)

{
  long *plVar1;
  long *pos_00;
  uint8_t *puVar2;
  int iVar3;
  uintptr_t raw;
  long *plVar4;
  
  iVar3 = -1;
  if ((config != (pt_config *)0x0 && (pos != (uint8_t *)0x0 && sync != (uint8_t **)0x0)) &&
     (plVar1 = (long *)config->end, pos <= plVar1 && config->begin <= pos)) {
    iVar3 = -7;
    plVar4 = (long *)((ulong)(pos + 7) & 0xfffffffffffffff8) + 1;
    pos_00 = (long *)((ulong)(pos + 7) & 0xfffffffffffffff8);
    while (plVar4 <= plVar1) {
      if (((*pos_00 == 0x282028202820282) || (*pos_00 == -0x7dfd7dfd7dfd7dfe)) &&
         (puVar2 = pt_find_psb((uint8_t *)pos_00,config), pos <= puVar2)) {
        *sync = puVar2;
        return 0;
      }
      plVar4 = pos_00 + 2;
      pos_00 = pos_00 + 1;
    }
  }
  return iVar3;
}

Assistant:

int pt_sync_forward(const uint8_t **sync, const uint8_t *pos,
		    const struct pt_config *config)
{
	const uint8_t *begin, *end, *start;

	if (!sync || !pos || !config)
		return -pte_internal;

	start = pos;
	begin = config->begin;
	end = config->end;

	if (!pt_sync_within_bounds(pos, begin, end))
		return -pte_internal;

	/* We search for a full 64bit word. It's OK to skip the current one. */
	pos = align(pos, sizeof(*psb_pattern));

	/* Search for the psb payload pattern in the buffer. */
	for (;;) {
		const uint8_t *current = pos;
		uint64_t val;

		pos += sizeof(uint64_t);
		if (end < pos)
			return -pte_eos;

		val = * (const uint64_t *) current;

		if ((val != psb_pattern[0]) && (val != psb_pattern[1]))
			continue;

		/* We found a 64bit word's worth of psb payload pattern. */
		current = pt_find_psb(current, config);
		if (!current)
			continue;

		/* If @start points inside a PSB, we may find that one.  Ignore
		 * it unless @start points to its beginning.
		 */
		if (current < start)
			continue;

		*sync = current;
		return 0;
	}
}